

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

void __thiscall
BailOutRecord::RestoreValues
          (BailOutRecord *this,BailOutKind bailOutKind,JavascriptCallStackLayout *layout,
          InterpreterStackFrame *newInstance,ScriptContext *scriptContext,bool fromLoopBody,
          Var *registerSaves,BailOutReturnValue *bailOutReturnValue,Var *pArgumentsObject,
          Var branchValue,void *returnAddress,bool useStartCall,void *argoutRestoreAddress)

{
  byte bVar1;
  GlobalBailOutRecordDataTable *pGVar2;
  StackLiteralBailOutRecord *pSVar3;
  Utf8SourceInfo *pUVar4;
  code *pcVar5;
  bool bVar6;
  RegNum RVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint32 uVar11;
  RegSlot RVar12;
  undefined4 *puVar13;
  Var aValue;
  DynamicObject *this_00;
  ulong uVar14;
  FunctionBody *pFVar15;
  ArgOutOffsetInfo *pAVar16;
  FunctionInfo *pFVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint i;
  Var *ppvVar21;
  ulong uVar22;
  GlobalBailOutRecordDataRow *pGVar23;
  
  scriptContext->firstInterpreterFrameReturnAddress = returnAddress;
  uVar22 = (ulong)this->stackLiteralBailOutRecordCount;
  if (this->stackLiteralBailOutRecordCount != 0) {
    pGVar2 = this->globalBailOutRecordTable;
    uVar20 = (ulong)pGVar2->length;
    if (pGVar2->length != 0) {
      uVar19 = this->m_bailOutRecordId;
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar14 = 0;
      do {
        if (uVar19 <= pGVar2->globalBailOutRecordDataRows[uVar14].end) {
          pGVar23 = pGVar2->globalBailOutRecordDataRows + uVar14;
          if (uVar19 < pGVar23->start) break;
          if ((int)uVar22 == 0) {
            uVar22 = 0;
          }
          else {
            uVar20 = 0;
            do {
              pSVar3 = this->stackLiteralBailOutRecord;
              uVar18 = *(uint *)&pGVar23->field_0xc;
              if (pSVar3[uVar20].regSlot == (uVar18 & 0x3fffffff)) {
                if ((uVar18 >> 0x1e & 1) != 0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar13 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                     ,0x2ae,"(!row->isFloat)","!row->isFloat");
                  if (!bVar6) goto LAB_003f8156;
                  *puVar13 = 0;
                  uVar18 = *(uint *)&pGVar23->field_0xc;
                }
                if ((int)uVar18 < 0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar13 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                     ,0x2af,"(!row->isInt)","!row->isInt");
                  if (!bVar6) goto LAB_003f8156;
                  *puVar13 = 0;
                }
                uVar10 = pGVar23->offset;
                if ((long)(int)uVar10 < 0) {
                  aValue = Js::JavascriptCallStackLayout::GetOffset(layout,uVar10);
                }
                else {
                  uVar8 = GetBailOutRegisterSaveSlotCount();
                  if (uVar8 < uVar10) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar13 = 1;
                    bVar6 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                       ,700,"((uint)offset <= GetBailOutRegisterSaveSlotCount())",
                                       "(uint)offset <= GetBailOutRegisterSaveSlotCount()");
                    if (!bVar6) goto LAB_003f8156;
                    *puVar13 = 0;
                  }
                  ppvVar21 = registerSaves;
                  if (registerSaves == (Var *)0x0) {
                    ppvVar21 = scriptContext->threadContext->bailOutRegisterSaveSpace;
                  }
                  RVar7 = LinearScanMD::GetRegisterFromSaveIndex(uVar10);
                  if (RegTypes[RVar7] == TyFloat64) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar13 = 1;
                    bVar6 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                       ,0x2be,
                                       "(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64)"
                                       ,
                                       "RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64"
                                      );
                    if (!bVar6) goto LAB_003f8156;
                    *puVar13 = 0;
                  }
                  aValue = ppvVar21[(long)(int)uVar10 + -1];
                }
                bVar6 = Js::DynamicObject::IsBaseDynamicObject(aValue);
                if (!bVar6) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar13 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                     ,0x2c1,"(Js::DynamicObject::IsBaseDynamicObject(value))",
                                     "Js::DynamicObject::IsBaseDynamicObject(value)");
                  if (!bVar6) goto LAB_003f8156;
                  *puVar13 = 0;
                }
                bVar6 = ThreadContext::IsOnStack(aValue);
                if (!bVar6) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar13 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                     ,0x2c2,"(ThreadContext::IsOnStack(value))",
                                     "ThreadContext::IsOnStack(value)");
                  if (!bVar6) goto LAB_003f8156;
                  *puVar13 = 0;
                }
                this_00 = Js::VarTo<Js::DynamicObject>(aValue);
                uVar9 = (*(this_00->super_RecyclableObject).super_FinalizableObject.
                          super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[10])(this_00);
                uVar18 = pSVar3[uVar20].initFldCount;
                if (uVar18 < uVar9) {
                  do {
                    Js::DynamicObject::SetSlot(this_00,-1,false,uVar18,(Var)0x0);
                    uVar18 = uVar18 + 1;
                  } while (uVar9 != uVar18);
                }
              }
              uVar20 = uVar20 + 1;
              uVar22 = (ulong)this->stackLiteralBailOutRecordCount;
            } while (uVar20 < uVar22);
            uVar20 = (ulong)pGVar2->length;
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < uVar20);
    }
  }
  if (this->localOffsetsCount != 0) {
    pFVar15 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    if (DAT_015bc46a == '\x01') {
      uVar10 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar15);
      pFVar17 = (pFVar15->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar17 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar6) goto LAB_003f8156;
        *puVar13 = 0;
        pFVar17 = (pFVar15->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar10,pFVar17->functionId)
      ;
      if ((bVar6) &&
         ((DAT_015bf388 == DAT_015bf390 ||
          (bVar6 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar6)))) {
        Output::Print(L"BailOut:   Register #%3d: Not live\n",0);
      }
    }
    uVar22 = 1;
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    while( true ) {
      uVar11 = Js::FunctionBody::GetCountField(pFVar15,ConstantCount);
      if (uVar11 <= (uint)uVar22) break;
      if (DAT_015bc46a == '\x01') {
        uVar10 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar15);
        pFVar17 = (pFVar15->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar17 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar6) goto LAB_003f8156;
          *puVar13 = 0;
          pFVar17 = (pFVar15->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        bVar6 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015b6718,BailOutPhase,uVar10,pFVar17->functionId);
        if ((bVar6) &&
           ((DAT_015bf388 == DAT_015bf390 ||
            (bVar6 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar6)))) {
          Output::Print(L"BailOut:   Register #%3d: Constant table\n",uVar22);
        }
      }
      uVar22 = (ulong)((uint)uVar22 + 1);
    }
    pUVar4 = (pFVar15->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    bVar1 = pUVar4->field_0xa8;
    if ((byte)((bVar1 >> 5 | (pUVar4->debugModeSource).ptr != (uchar *)0x0) & (bVar1 & 0x40) >> 6)
        != 0) {
      AdjustOffsetsForDiagMode(this,layout,*(ScriptFunction **)(newInstance + 0x80));
    }
    RestoreValues(this,bailOutKind,layout,this->localOffsetsCount,(int *)0x0,0,
                  (Var *)(newInstance + 0x160),scriptContext,fromLoopBody,registerSaves,newInstance,
                  pArgumentsObject,(void *)0x0);
  }
  if (((useStartCall) && (pAVar16 = this->argOutOffsetInfo, pAVar16 != (ArgOutOffsetInfo *)0x0)) &&
     (pAVar16->startCallCount != 0)) {
    uVar20 = 0;
    uVar22 = 0;
    do {
      uVar10 = pAVar16->startCallOutParamCounts[uVar20];
      Js::InterpreterStackFrame::OP_StartCall(newInstance,uVar10);
      RestoreValues(this,bailOutKind,layout,uVar10,this->argOutOffsetInfo->outParamOffsets + uVar22,
                    this->argOutOffsetInfo->argOutSymStart + (int)uVar22,
                    *(Var **)(newInstance + 0x28),scriptContext,fromLoopBody,registerSaves,
                    newInstance,pArgumentsObject,(void *)0x0);
      uVar22 = (ulong)((int)uVar22 + uVar10);
      uVar20 = uVar20 + 1;
      pAVar16 = this->argOutOffsetInfo;
    } while (uVar20 < pAVar16->startCallCount);
  }
  if ((*(JavascriptFunction **)(newInstance + 0x80) == (JavascriptFunction *)0x0) ||
     (pFVar15 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80)),
     pFVar15 == (FunctionBody *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x2fc,"(newInstance->function && newInstance->function->GetFunctionBody())",
                       "newInstance->function && newInstance->function->GetFunctionBody()");
    if (!bVar6) goto LAB_003f8156;
    *puVar13 = 0;
  }
  if (((!fromLoopBody) &&
      (pFVar15 = Js::JavascriptFunction::GetFunctionBody
                           (*(JavascriptFunction **)(newInstance + 0x80)),
      (pFVar15->super_ParseableFunctionInfo).m_inParamCount != 0)) &&
     (*(long *)(newInstance + 0x40) == 0)) {
    *(Var *)(newInstance + 0x40) = *pArgumentsObject;
  }
  if ((bailOutReturnValue != (BailOutReturnValue *)0x0) &&
     (uVar19 = bailOutReturnValue->returnValueRegSlot, uVar19 != 0xffffffff)) {
    if (bailOutReturnValue->returnValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x306,"(bailOutReturnValue->returnValue != nullptr)",
                         "bailOutReturnValue->returnValue != nullptr");
      if (!bVar6) goto LAB_003f8156;
      *puVar13 = 0;
      uVar19 = bailOutReturnValue->returnValueRegSlot;
    }
    pFVar15 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    RVar12 = Js::FunctionBody::GetLocalsCount(pFVar15);
    if (RVar12 <= uVar19) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x307,
                         "(bailOutReturnValue->returnValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount())"
                         ,
                         "bailOutReturnValue->returnValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount()"
                        );
      if (!bVar6) goto LAB_003f8156;
      *puVar13 = 0;
    }
    *(Var *)(newInstance + (ulong)bailOutReturnValue->returnValueRegSlot * 8 + 0x160) =
         bailOutReturnValue->returnValue;
    if (DAT_015bc46a == '\x01') {
      pFVar15 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar10 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar15);
      pFVar15 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      pFVar17 = (pFVar15->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar17 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar13 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar6) goto LAB_003f8156;
        *puVar13 = 0;
        pFVar17 = (pFVar15->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar10,pFVar17->functionId)
      ;
      if ((bVar6) &&
         ((DAT_015bf388 == DAT_015bf390 ||
          (bVar6 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar6)))) {
        Output::Print(L"BailOut:   Register #%3d: Return, value: 0x%p\n",
                      (ulong)bailOutReturnValue->returnValueRegSlot,bailOutReturnValue->returnValue)
        ;
      }
    }
  }
  if (this->branchValueRegSlot != 0xffffffff) {
    if ((branchValue == (Var)0x0) || (bVar6 = Js::VarIs<Js::JavascriptBoolean>(branchValue), !bVar6)
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x311,"(branchValue && Js::VarIs<Js::JavascriptBoolean>(branchValue))",
                         "branchValue && Js::VarIs<Js::JavascriptBoolean>(branchValue)");
      if (!bVar6) goto LAB_003f8156;
      *puVar13 = 0;
    }
    uVar19 = this->branchValueRegSlot;
    pFVar15 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    RVar12 = Js::FunctionBody::GetLocalsCount(pFVar15);
    if (RVar12 <= uVar19) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x312,
                         "(branchValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount())"
                         ,
                         "branchValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount()"
                        );
      if (!bVar6) {
LAB_003f8156:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar13 = 0;
    }
    *(Var *)(newInstance + (ulong)this->branchValueRegSlot * 8 + 0x160) = branchValue;
  }
  ppvVar21 = scriptContext->threadContext->bailOutRegisterSaveSpace;
  uVar10 = GetBailOutRegisterSaveSlotCount();
  memset(ppvVar21,0,(ulong)uVar10 << 3);
  scriptContext->firstInterpreterFrameReturnAddress = (void *)0x0;
  return;
}

Assistant:

void
BailOutRecord::RestoreValues(IR::BailOutKind bailOutKind, Js::JavascriptCallStackLayout * layout, Js::InterpreterStackFrame * newInstance,
    Js::ScriptContext * scriptContext, bool fromLoopBody, Js::Var * registerSaves, BailOutReturnValue * bailOutReturnValue, Js::Var* pArgumentsObject,
    Js::Var branchValue, void * returnAddress, bool useStartCall /* = true */, void * argoutRestoreAddress) const
{
    Js::AutoPushReturnAddressForStackWalker saveReturnAddress(scriptContext, returnAddress);

    if (this->stackLiteralBailOutRecordCount)
    {
        // Null out the field on the stack literal that hasn't fully initialized yet.

        globalBailOutRecordTable->IterateGlobalBailOutRecordTableRows(m_bailOutRecordId, [=](GlobalBailOutRecordDataRow  *row)
        {
            for (uint i = 0; i < this->stackLiteralBailOutRecordCount; i++)
            {
                BailOutRecord::StackLiteralBailOutRecord& record = this->stackLiteralBailOutRecord[i];

                if (record.regSlot == row->regSlot)
                {
                    // Partially initialized stack literal shouldn't be type specialized yet.
                    Assert(!row->isFloat);
                    Assert(!row->isInt);

                    int offset = row->offset;
                    Js::Var value;
                    if (offset < 0)
                    {
                        // Stack offset
                        value = layout->GetOffset(offset);
                    }
                    else
                    {
                        // The value is in register
                        // Index is one based, so subtract one
                        Assert((uint)offset <= GetBailOutRegisterSaveSlotCount());
                        Js::Var * registerSaveSpace = registerSaves ? registerSaves : (Js::Var *)scriptContext->GetThreadContext()->GetBailOutRegisterSaveSpace();
                        Assert(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64);
                        value = registerSaveSpace[offset - 1];
                    }
                    Assert(Js::DynamicObject::IsBaseDynamicObject(value));
                    Assert(ThreadContext::IsOnStack(value));

                    Js::DynamicObject * obj = Js::VarTo<Js::DynamicObject>(value);
                    uint propertyCount = obj->GetPropertyCount();
                    for (uint j = record.initFldCount; j < propertyCount; j++)
                    {
                        obj->SetSlot(SetSlotArgumentsRoot(Js::Constants::NoProperty, false, j, nullptr));
                    }
                }
            }
        });
    }

    if (this->localOffsetsCount)
    {
        Js::FunctionBody* functionBody = newInstance->function->GetFunctionBody();
#if ENABLE_DEBUG_CONFIG_OPTIONS
        BAILOUT_VERBOSE_TRACE(functionBody, bailOutKind, _u("BailOut:   Register #%3d: Not live\n"), 0);

        for (uint i = 1; i < functionBody->GetConstantCount(); i++)
        {
            BAILOUT_VERBOSE_TRACE(functionBody, bailOutKind, _u("BailOut:   Register #%3d: Constant table\n"), i);
        }
#endif

        if (functionBody->IsInDebugMode())
        {
            this->AdjustOffsetsForDiagMode(layout, newInstance->GetJavascriptFunction());
        }

        this->RestoreValues(bailOutKind, layout, this->localOffsetsCount,
            nullptr, 0, newInstance->m_localSlots, scriptContext, fromLoopBody, registerSaves, newInstance, pArgumentsObject);
    }

    if (useStartCall && this->argOutOffsetInfo)
    {
        uint outParamSlot = 0;
        void * argRestoreAddr = nullptr;
        for (uint i = 0; i < this->argOutOffsetInfo->startCallCount; i++)
        {
            uint startCallOutParamCount = this->argOutOffsetInfo->startCallOutParamCounts[i];
#ifdef _M_IX86
            if (argoutRestoreAddress)
            {
                argRestoreAddr = (void*)((char*)argoutRestoreAddress + (this->startCallArgRestoreAdjustCounts[i] * MachPtr));
            }
#endif
            newInstance->OP_StartCall(startCallOutParamCount);
            this->RestoreValues(bailOutKind, layout, startCallOutParamCount, &this->argOutOffsetInfo->outParamOffsets[outParamSlot],
                this->argOutOffsetInfo->argOutSymStart + outParamSlot, newInstance->m_outParams,
                scriptContext, fromLoopBody, registerSaves, newInstance, pArgumentsObject, argRestoreAddr);
            outParamSlot += startCallOutParamCount;
        }
    }

    // If we're not in a loop body, then the arguments object is not on the local frame.
    // If the RestoreValues created an arguments object for us, then it's already on the interpreter instance.
    // Otherwise, we need to propagate the object from the jitted frame to the interpreter.
    Assert(newInstance->function && newInstance->function->GetFunctionBody());
    bool hasArgumentSlot =      // Be consistent with Func::HasArgumentSlot.
        !fromLoopBody && newInstance->function->GetFunctionBody()->GetInParamsCount() != 0;
    if (hasArgumentSlot && newInstance->m_arguments == nullptr)
    {
        newInstance->m_arguments = *pArgumentsObject;
    }

    if (bailOutReturnValue != nullptr && bailOutReturnValue->returnValueRegSlot != Js::Constants::NoRegister)
    {
        Assert(bailOutReturnValue->returnValue != nullptr);
        Assert(bailOutReturnValue->returnValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount());
        newInstance->m_localSlots[bailOutReturnValue->returnValueRegSlot] = bailOutReturnValue->returnValue;

        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("BailOut:   Register #%3d: Return, value: 0x%p\n"),
            bailOutReturnValue->returnValueRegSlot, bailOutReturnValue->returnValue);
    }

    if (branchValueRegSlot != Js::Constants::NoRegister)
    {
        // Used when a t1 = CmCC is optimize to BrCC, and the branch bails out. T1 needs to be restored
        Assert(branchValue && Js::VarIs<Js::JavascriptBoolean>(branchValue));
        Assert(branchValueRegSlot < newInstance->GetJavascriptFunction()->GetFunctionBody()->GetLocalsCount());
        newInstance->m_localSlots[branchValueRegSlot] = branchValue;
    }

#if DBG
    // Clear the register save area for the next bailout
    memset((void*)scriptContext->GetThreadContext()->GetBailOutRegisterSaveSpace(), 0, GetBailOutRegisterSaveSlotCount() * sizeof(Js::Var));
#endif
}